

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O0

int cnn::rand0n(int n)

{
  float fVar1;
  int in_EDI;
  real rVar2;
  int x;
  int local_8;
  
  if (0 < in_EDI) {
    rVar2 = rand01();
    fVar1 = rVar2 * (float)in_EDI;
    while (local_8 = (int)fVar1, in_EDI == local_8) {
      rVar2 = rand01();
      fVar1 = rVar2 * (float)in_EDI;
    }
    return local_8;
  }
  __assert_fail("n > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/tensor.cc"
                ,0x90,"int cnn::rand0n(int)");
}

Assistant:

int rand0n(int n) {
  assert(n > 0);
  int x = rand01() * n;
  while(n == x) { x = rand01() * n; }
  return x;
}